

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qhttp2protocolhandler_p.cpp
# Opt level: O0

void * __thiscall QHttp2ProtocolHandler::qt_metacast(QHttp2ProtocolHandler *this,char *_clname)

{
  int iVar1;
  char *in_RSI;
  char *in_RDI;
  char *local_8;
  
  if (in_RSI == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    iVar1 = strcmp(in_RSI,qt_staticMetaObjectStaticContent<(anonymous_namespace)::qt_meta_tag_ZN21QHttp2ProtocolHandlerE_t>
                          .strings);
    local_8 = in_RDI;
    if (iVar1 != 0) {
      iVar1 = strcmp(in_RSI,"QAbstractProtocolHandler");
      if (iVar1 == 0) {
        local_8 = in_RDI + 0x10;
      }
      else {
        local_8 = (char *)QObject::qt_metacast(in_RDI);
      }
    }
  }
  return local_8;
}

Assistant:

void *QHttp2ProtocolHandler::qt_metacast(const char *_clname)
{
    if (!_clname) return nullptr;
    if (!strcmp(_clname, qt_staticMetaObjectStaticContent<qt_meta_tag_ZN21QHttp2ProtocolHandlerE_t>.strings))
        return static_cast<void*>(this);
    if (!strcmp(_clname, "QAbstractProtocolHandler"))
        return static_cast< QAbstractProtocolHandler*>(this);
    return QObject::qt_metacast(_clname);
}